

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  ImVec2 IVar2;
  unsigned_long_long uVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYRef<unsigned_long_long> *pGVar9;
  GetterXsYRef<unsigned_long_long> *pGVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  int iVar18;
  long lVar19;
  ImDrawIdx IVar20;
  ImPlotContext *gp;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  float fVar25;
  double dVar26;
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  pGVar9 = this->Getter1;
  pGVar10 = this->Getter2;
  iVar18 = pGVar9->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)(((pGVar9->Offset + prim) % iVar18 + iVar18) % iVar18) * (long)pGVar9->Stride);
  iVar18 = this->Transformer->YAxis;
  iVar6 = pGVar10->Count;
  lVar19 = (long)(((prim + pGVar10->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar10->Stride;
  IVar2 = GImPlot->PixelRange[iVar18].Min;
  dVar24 = (double)IVar2.x;
  dVar26 = (double)IVar2.y;
  uVar3 = *(unsigned_long_long *)((long)pGVar10->Xs + lVar19);
  dVar4 = GImPlot->CurrentPlot->YAxis[iVar18].Range.Min;
  dVar5 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar21 = (float)((pGVar9->YRef - dVar4) * GImPlot->My[iVar18] + dVar26);
  fVar22 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) - dVar5) *
                   GImPlot->Mx + dVar24);
  fVar23 = (float)((pGVar10->YRef - dVar4) * GImPlot->My[iVar18] + dVar26);
  fVar25 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) - dVar5) *
                   GImPlot->Mx + dVar24);
  uVar27 = CONCAT44(-(uint)(fVar25 <= fVar22),-(uint)(fVar23 <= fVar21));
  auVar15._4_8_ = dVar5;
  auVar15._0_4_ = fVar22;
  auVar30._0_8_ = auVar15._0_8_ << 0x20;
  auVar30._8_4_ = fVar21;
  auVar30._12_4_ = fVar22;
  auVar16._4_8_ = auVar30._8_8_;
  auVar16._0_4_ = -(uint)(fVar22 < fVar25);
  auVar31._0_8_ = auVar16._0_8_ << 0x20;
  auVar31._8_4_ = -(uint)(fVar21 < fVar23);
  auVar31._12_4_ = -(uint)(fVar22 < fVar25);
  uVar14 = CONCAT44(fVar22,fVar21) & auVar31._8_8_;
  auVar32._0_8_ = ~uVar27 & CONCAT44(fVar25,fVar23);
  auVar32._8_8_ = ~auVar31._8_8_ & CONCAT44(fVar25,fVar23);
  auVar13._8_4_ = (int)uVar14;
  auVar13._0_8_ = CONCAT44(fVar22,fVar21) & uVar27;
  auVar13._12_4_ = (int)(uVar14 >> 0x20);
  auVar32 = auVar32 | auVar13;
  fVar35 = (cull_rect->Min).x;
  auVar34._4_4_ = -(uint)(fVar35 < auVar32._4_4_);
  auVar34._0_4_ = -(uint)((cull_rect->Min).y < auVar32._0_4_);
  auVar17._4_8_ = auVar32._8_8_;
  auVar17._0_4_ = -(uint)(auVar32._4_4_ < fVar35);
  auVar33._0_8_ = auVar17._0_8_ << 0x20;
  auVar33._8_4_ = -(uint)(auVar32._8_4_ < (cull_rect->Max).y);
  auVar33._12_4_ = -(uint)(auVar32._12_4_ < (cull_rect->Max).x);
  auVar34._8_8_ = auVar33._8_8_;
  iVar18 = movmskps((int)lVar19,auVar34);
  if (iVar18 == 0xf) {
    IVar7 = this->Col;
    IVar2 = *uv;
    fVar28 = fVar23 - fVar21;
    fVar35 = fVar25 - fVar22;
    fVar29 = fVar35 * fVar35 + fVar28 * fVar28;
    if (0.0 < fVar29) {
      fVar29 = 1.0 / SQRT(fVar29);
      fVar35 = fVar35 * fVar29;
      fVar28 = fVar28 * fVar29;
    }
    fVar29 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    fVar35 = fVar29 * fVar35;
    fVar29 = fVar29 * fVar28;
    (pIVar11->pos).x = fVar29 + fVar22;
    (pIVar11->pos).y = fVar21 - fVar35;
    (pIVar11->uv).x = IVar2.x;
    (pIVar11->uv).y = IVar2.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar7;
    pIVar11[1].pos.x = fVar29 + fVar25;
    pIVar11[1].pos.y = fVar23 - fVar35;
    pIVar11[1].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar7;
    pIVar11[2].pos.x = fVar25 - fVar29;
    pIVar11[2].pos.y = fVar35 + fVar23;
    pIVar11[2].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar7;
    pIVar11[3].pos.x = fVar22 - fVar29;
    pIVar11[3].pos.y = fVar35 + fVar21;
    pIVar11[3].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar20 = (ImDrawIdx)uVar8;
    *pIVar12 = IVar20;
    pIVar12[1] = IVar20 + 1;
    pIVar12[2] = IVar20 + 2;
    pIVar12[3] = IVar20;
    pIVar12[4] = IVar20 + 2;
    pIVar12[5] = IVar20 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }